

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result wabt::interp::Match(TableType *expected,TableType *actual,string *out_msg)

{
  bool bVar1;
  Result result;
  undefined8 uVar2;
  ValueType type;
  undefined1 auVar3 [16];
  string local_a0;
  interp *local_80;
  string local_78;
  string local_58;
  Type local_38;
  Type local_30;
  string *local_28;
  string *out_msg_local;
  TableType *actual_local;
  TableType *expected_local;
  
  local_30 = *(Type *)&(expected->super_ExternType).field_0xc;
  local_38 = *(Type *)&(actual->super_ExternType).field_0xc;
  local_28 = out_msg;
  out_msg_local = (string *)actual;
  actual_local = expected;
  bVar1 = wabt::operator!=(local_30,local_38);
  if (bVar1) {
    local_80 = *(interp **)&(actual_local->super_ExternType).field_0xc;
    GetName_abi_cxx11_(&local_78,local_80,type);
    auVar3 = std::__cxx11::string::c_str();
    GetName_abi_cxx11_(&local_a0,*(interp **)((long)&out_msg_local->_M_string_length + 4),
                       auVar3._8_8_);
    uVar2 = std::__cxx11::string::c_str();
    StringPrintf_abi_cxx11_
              (&local_58,"type mismatch in imported table, expected %s but got %s.",auVar3._0_8_,
               uVar2);
    std::__cxx11::string::operator=((string *)local_28,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_78);
    Result::Result((Result *)((long)&expected_local + 4),Error);
  }
  else {
    result = Match(&actual_local->limits,(Limits *)((long)&out_msg_local->field_2 + 8),local_28);
    bVar1 = Failed(result);
    if (bVar1) {
      Result::Result((Result *)((long)&expected_local + 4),Error);
    }
    else {
      Result::Result((Result *)((long)&expected_local + 4),Ok);
    }
  }
  return (Result)expected_local._4_4_;
}

Assistant:

Result Match(const TableType& expected,
             const TableType& actual,
             std::string* out_msg) {
  if (expected.element != actual.element) {
    *out_msg = StringPrintf(
        "type mismatch in imported table, expected %s but got %s.",
        GetName(expected.element).c_str(), GetName(actual.element).c_str());
    return Result::Error;
  }

  if (Failed(Match(expected.limits, actual.limits, out_msg))) {
    return Result::Error;
  }

  return Result::Ok;
}